

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidgload.c
# Opt level: O1

FT_Error cid_load_glyph(T1_Decoder_conflict decoder,FT_UInt glyph_index)

{
  FT_CharMap *ppFVar1;
  FT_Face pFVar2;
  FT_Stream stream;
  FT_CharMap *ppFVar3;
  uchar *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  FT_CharMap pFVar8;
  FT_CharMap pFVar9;
  FT_Long FVar10;
  char cVar11;
  FT_Byte *buffer;
  FT_Fixed FVar12;
  long lVar13;
  ulong uVar14;
  uchar *puVar15;
  uint uVar16;
  FT_Incremental_InterfaceRec *pFVar17;
  ulong uVar18;
  FT_Memory memory;
  FT_Byte *pFVar19;
  bool bVar20;
  FT_Error error;
  FT_Data glyph_data;
  CFF_SubFontRec subfont;
  FT_Error local_a20;
  FT_UInt local_a1c;
  FT_Memory local_a18;
  FT_Long local_a10;
  FT_Byte *local_a08;
  FT_Incremental_InterfaceRec *local_a00;
  T1_Decoder_conflict local_9f8;
  FT_Face local_9f0;
  FT_Incremental_MetricsRec local_9e8 [33];
  undefined1 *local_5c8;
  undefined1 local_4f8 [1224];
  
  pFVar2 = (decoder->builder).face;
  stream = (FT_Stream)pFVar2[2].bbox.yMax;
  local_a20 = 0;
  local_a18 = pFVar2->memory;
  local_a10 = pFVar2[1].face_index;
  pFVar17 = pFVar2->internal->incremental_interface;
  local_a00 = pFVar17;
  if (pFVar17 == (FT_Incremental_InterfaceRec *)0x0) {
    uVar16 = *(int *)&pFVar2[2].field_0x3c + pFVar2[2].num_fixed_sizes;
    pFVar17 = (FT_Incremental_InterfaceRec *)(ulong)uVar16;
    local_a20 = FT_Stream_Seek(stream,(FT_ULong)
                                      (pFVar2[2].style_name +
                                      (ulong)(uVar16 * glyph_index) + (long)pFVar2[2].generic.data))
    ;
    if (local_a20 == 0) {
      pFVar17 = (FT_Incremental_InterfaceRec *)(ulong)(uVar16 * 2);
      local_a20 = FT_Stream_EnterFrame(stream,(FT_ULong)pFVar17);
      if (local_a20 == 0) {
        puVar4 = stream->cursor;
        uVar16 = pFVar2[2].num_fixed_sizes;
        if ((char)uVar16 == '\0') {
          pFVar17 = (FT_Incremental_InterfaceRec *)0x0;
          puVar15 = puVar4;
        }
        else {
          lVar13 = 0;
          pFVar17 = (FT_Incremental_InterfaceRec *)0x0;
          do {
            pFVar17 = (FT_Incremental_InterfaceRec *)((ulong)puVar4[lVar13] | (long)pFVar17 << 8);
            lVar13 = lVar13 + 1;
          } while ((char)uVar16 != (char)lVar13);
          puVar15 = puVar4 + (uVar16 & 0xff);
        }
        cVar11 = (char)*(uint *)&pFVar2[2].field_0x3c;
        if (cVar11 == '\0') {
          uVar14 = 0;
        }
        else {
          lVar13 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 << 8 | (ulong)puVar15[lVar13];
            lVar13 = lVar13 + 1;
          } while (cVar11 != (char)lVar13);
        }
        if (cVar11 == '\0') {
          uVar18 = 0;
        }
        else {
          lVar13 = 0;
          uVar18 = 0;
          do {
            uVar18 = uVar18 << 8 |
                     (ulong)puVar4[lVar13 + (ulong)(*(uint *)&pFVar2[2].field_0x3c & 0xff) +
                                            (ulong)(uVar16 & 0xff) + (long)(int)uVar16];
            lVar13 = lVar13 + 1;
          } while (cVar11 != (char)lVar13);
        }
        local_a1c = glyph_index;
        FT_Stream_ExitFrame(stream);
        if (((pFVar17 < (FT_Incremental_InterfaceRec *)(long)pFVar2[2].num_charmaps) &&
            (uVar18 <= stream->size)) && (uVar14 <= uVar18)) {
          uVar18 = uVar18 - uVar14;
          if (uVar18 != 0) {
            buffer = (FT_Byte *)ft_mem_alloc(local_a18,uVar18,&local_a20);
            if (local_a20 == 0) {
              local_a20 = FT_Stream_ReadAt(stream,uVar14 + (long)pFVar2[2].generic.data,buffer,
                                           uVar18);
              bVar20 = local_a20 == 0;
              glyph_index = local_a1c;
            }
            else {
              bVar20 = false;
              glyph_index = local_a1c;
            }
            goto LAB_001465ef;
          }
        }
        else {
          local_a20 = 9;
        }
        bVar20 = false;
        uVar18 = 0;
        buffer = (FT_Byte *)0x0;
        glyph_index = local_a1c;
        goto LAB_001465ef;
      }
    }
LAB_00146574:
    bVar20 = false;
    uVar18 = 0;
    buffer = (FT_Byte *)0x0;
  }
  else {
    local_a20 = (*pFVar17->funcs->get_glyph_data)(pFVar17->object,glyph_index,(FT_Data *)local_9e8);
    if (local_a20 != 0) goto LAB_00146574;
    cVar11 = (char)pFVar2[2].num_fixed_sizes;
    if (cVar11 == '\0') {
      pFVar17 = (FT_Incremental_InterfaceRec *)0x0;
    }
    else {
      lVar13 = 0;
      pFVar17 = (FT_Incremental_InterfaceRec *)0x0;
      do {
        pFVar17 = (FT_Incremental_InterfaceRec *)
                  ((long)pFVar17 << 8 | (ulong)*(byte *)(local_9e8[0].bearing_x + lVar13));
        lVar13 = lVar13 + 1;
      } while (cVar11 != (char)lVar13);
    }
    if ((int)local_9e8[0].bearing_y == 0) {
      uVar18 = 0;
      buffer = (FT_Byte *)0x0;
    }
    else {
      uVar18 = (ulong)((int)local_9e8[0].bearing_y - pFVar2[2].num_fixed_sizes);
      buffer = (FT_Byte *)ft_mem_alloc(local_a18,uVar18,&local_a20);
      if (local_a20 == 0) {
        memcpy(buffer,(void *)(local_9e8[0].bearing_x + pFVar2[2].num_fixed_sizes),uVar18);
      }
    }
    (*local_a00->funcs->free_glyph_data)(local_a00->object,(FT_Data *)local_9e8);
    bVar20 = local_a20 == 0;
  }
LAB_001465ef:
  if (!bVar20) {
    bVar20 = false;
    memory = local_a18;
    goto LAB_001467ab;
  }
  lVar13 = pFVar2[2].bbox.xMin;
  decoder->num_subrs = *(FT_Int *)(lVar13 + (long)pFVar17 * 0x10);
  decoder->subrs = *(FT_Byte ***)(lVar13 + 8 + (long)pFVar17 * 0x10);
  decoder->subrs_len = (FT_UInt *)0x0;
  decoder->subrs_hash = (FT_Hash)0x0;
  ppFVar3 = pFVar2[2].charmaps;
  pFVar8 = ppFVar3[(long)pFVar17 * 0x2a + 0x21];
  pFVar9 = (ppFVar3 + (long)pFVar17 * 0x2a + 0x21)[1];
  ppFVar1 = ppFVar3 + (long)pFVar17 * 0x2a + 0x23;
  uVar5 = *(undefined4 *)((long)ppFVar1 + 4);
  uVar6 = *(undefined4 *)(ppFVar1 + 1);
  uVar7 = *(undefined4 *)((long)ppFVar1 + 0xc);
  *(undefined4 *)&(decoder->font_matrix).yx = *(undefined4 *)ppFVar1;
  *(undefined4 *)((long)&(decoder->font_matrix).yx + 4) = uVar5;
  *(undefined4 *)&(decoder->font_matrix).yy = uVar6;
  *(undefined4 *)((long)&(decoder->font_matrix).yy + 4) = uVar7;
  (decoder->font_matrix).xx = (FT_Fixed)pFVar8;
  (decoder->font_matrix).xy = (FT_Fixed)pFVar9;
  ppFVar1 = ppFVar3 + (long)pFVar17 * 0x2a + 0x25;
  uVar5 = *(undefined4 *)((long)ppFVar1 + 4);
  uVar6 = *(undefined4 *)(ppFVar1 + 1);
  uVar7 = *(undefined4 *)((long)ppFVar1 + 0xc);
  *(undefined4 *)&(decoder->font_offset).x = *(undefined4 *)ppFVar1;
  *(undefined4 *)((long)&(decoder->font_offset).x + 4) = uVar5;
  *(undefined4 *)&(decoder->font_offset).y = uVar6;
  *(undefined4 *)((long)&(decoder->font_offset).y + 4) = uVar7;
  uVar16 = *(uint *)((long)ppFVar3 + (long)pFVar17 * 0x150 + 4);
  decoder->lenIV = uVar16;
  uVar14 = 0;
  if (-1 < (int)uVar16) {
    uVar14 = (ulong)uVar16;
  }
  local_a1c = glyph_index;
  local_9f0 = pFVar2;
  if (uVar18 < uVar14) {
    local_a20 = 9;
LAB_001466ef:
    bVar20 = false;
  }
  else {
    local_a08 = buffer;
    if (-1 < (int)uVar16) {
      (**(code **)(local_a10 + 0x20))(buffer,uVar18,0x10ea);
    }
    buffer = local_a08;
    FVar10 = local_a10;
    if ((decoder->builder).metrics_only != '\0') {
      local_a20 = (**(code **)(*(long *)(local_a10 + 0x18) + 0x10))
                            (decoder,local_a08 + uVar14,(int)uVar18 - (int)uVar14);
      goto LAB_001466ef;
    }
    local_9f8 = decoder;
    (**(code **)(local_a10 + 0x30))(local_9e8,decoder,1);
    (**(code **)(FVar10 + 0x38))(local_9f0,ppFVar3 + (long)pFVar17 * 0x2a);
    pFVar19 = buffer + uVar14;
    local_5c8 = local_4f8;
    local_a20 = (**(code **)(*(long *)(FVar10 + 0x18) + 0x18))(local_9e8,pFVar19,uVar18 - uVar14);
    decoder = local_9f8;
    bVar20 = (char)local_a20 == -0x5c;
    buffer = local_a08;
    if (bVar20) {
      *(undefined1 *)&(local_9f8->builder).glyph[1].library = 0;
      local_a20 = (**(code **)(*(long *)(FVar10 + 0x18) + 0x18))(local_9e8,pFVar19,uVar18 - uVar14);
      buffer = local_a08;
    }
  }
  pFVar17 = local_a00;
  memory = local_a18;
  if (((uVar14 <= uVar18) && (local_a00 != (FT_Incremental_InterfaceRec *)0x0)) &&
     ((local_a20 == 0 &&
      (local_a00->funcs->get_glyph_metrics != (FT_Incremental_GetGlyphMetricsFunc)0x0)))) {
    FVar12 = FT_RoundFix((decoder->builder).left_bearing.x);
    local_9e8[0].bearing_x = FVar12 >> 0x10;
    local_9e8[0].bearing_y = 0;
    FVar12 = FT_RoundFix((decoder->builder).advance.x);
    local_9e8[0].advance = FVar12 >> 0x10;
    FVar12 = FT_RoundFix((decoder->builder).advance.y);
    local_9e8[0].advance_v = FVar12 >> 0x10;
    local_a20 = (*pFVar17->funcs->get_glyph_metrics)(pFVar17->object,local_a1c,'\0',local_9e8);
    (decoder->builder).left_bearing.x = local_9e8[0].bearing_x << 0x10;
    (decoder->builder).advance.x = local_9e8[0].advance << 0x10;
    (decoder->builder).advance.y = local_9e8[0].advance_v << 0x10;
  }
LAB_001467ab:
  ft_mem_free(memory,buffer);
  *(bool *)((long)&(decoder->builder).glyph[1].library + 1) = bVar20;
  return local_a20;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cid_load_glyph( T1_Decoder  decoder,
                  FT_UInt     glyph_index )
  {
    CID_Face       face = (CID_Face)decoder->builder.face;
    CID_FaceInfo   cid  = &face->cid;
    FT_Byte*       p;
    FT_ULong       fd_select;
    FT_Stream      stream       = face->cid_stream;
    FT_Error       error        = FT_Err_Ok;
    FT_Byte*       charstring   = NULL;
    FT_Memory      memory       = face->root.memory;
    FT_ULong       glyph_length = 0;
    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Bool  force_scaling = FALSE;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec  *inc =
                                   face->root.internal->incremental_interface;
#endif


    FT_TRACE1(( "cid_load_glyph: glyph index %d\n", glyph_index ));

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* For incremental fonts get the character data using */
    /* the callback function.                             */
    if ( inc )
    {
      FT_Data  glyph_data;


      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, &glyph_data );
      if ( error )
        goto Exit;

      p         = (FT_Byte*)glyph_data.pointer;
      fd_select = cid_get_offset( &p, (FT_Byte)cid->fd_bytes );

      if ( glyph_data.length != 0 )
      {
        glyph_length = (FT_ULong)( glyph_data.length - cid->fd_bytes );
        (void)FT_ALLOC( charstring, glyph_length );
        if ( !error )
          ft_memcpy( charstring, glyph_data.pointer + cid->fd_bytes,
                     glyph_length );
      }

      inc->funcs->free_glyph_data( inc->object, &glyph_data );

      if ( error )
        goto Exit;
    }

    else

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    /* For ordinary fonts read the CID font dictionary index */
    /* and charstring offset from the CIDMap.                */
    {
      FT_UInt   entry_len = (FT_UInt)( cid->fd_bytes + cid->gd_bytes );
      FT_ULong  off1, off2;


      if ( FT_STREAM_SEEK( cid->data_offset + cid->cidmap_offset +
                           glyph_index * entry_len )               ||
           FT_FRAME_ENTER( 2 * entry_len )                         )
        goto Exit;

      p         = (FT_Byte*)stream->cursor;
      fd_select = cid_get_offset( &p, (FT_Byte)cid->fd_bytes );
      off1      = cid_get_offset( &p, (FT_Byte)cid->gd_bytes );
      p        += cid->fd_bytes;
      off2      = cid_get_offset( &p, (FT_Byte)cid->gd_bytes );
      FT_FRAME_EXIT();

      if ( fd_select >= (FT_ULong)cid->num_dicts ||
           off2 > stream->size                   ||
           off1 > off2                           )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      glyph_length = off2 - off1;
      if ( glyph_length == 0 )
        goto Exit;
      if ( FT_ALLOC( charstring, glyph_length ) )
        goto Exit;
      if ( FT_STREAM_READ_AT( cid->data_offset + off1,
                              charstring, glyph_length ) )
        goto Exit;
    }

    /* Now set up the subrs array and parse the charstrings. */
    {
      CID_FaceDict  dict;
      CID_Subrs     cid_subrs = face->subrs + fd_select;
      FT_UInt       cs_offset;


      /* Set up subrs */
      decoder->num_subrs  = cid_subrs->num_subrs;
      decoder->subrs      = cid_subrs->code;
      decoder->subrs_len  = 0;
      decoder->subrs_hash = NULL;

      /* Set up font matrix */
      dict                 = cid->font_dicts + fd_select;

      decoder->font_matrix = dict->font_matrix;
      decoder->font_offset = dict->font_offset;
      decoder->lenIV       = dict->private_dict.lenIV;

      /* Decode the charstring. */

      /* Adjustment for seed bytes. */
      cs_offset = decoder->lenIV >= 0 ? (FT_UInt)decoder->lenIV : 0;
      if ( cs_offset > glyph_length )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      /* Decrypt only if lenIV >= 0. */
      if ( decoder->lenIV >= 0 )
        psaux->t1_decrypt( charstring, glyph_length, 4330 );

      /* choose which renderer to use */
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
      if ( ( (PS_Driver)FT_FACE_DRIVER( face ) )->hinting_engine ==
               FT_HINTING_FREETYPE                                  ||
           decoder->builder.metrics_only                            )
        error = psaux->t1_decoder_funcs->parse_charstrings_old(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#else
      if ( decoder->builder.metrics_only )
        error = psaux->t1_decoder_funcs->parse_metrics(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#endif
      else
      {
        PS_Decoder      psdecoder;
        CFF_SubFontRec  subfont;


        psaux->ps_decoder_init( &psdecoder, decoder, TRUE );

        psaux->t1_make_subfont( FT_FACE( face ),
                                &dict->private_dict,
                                &subfont );
        psdecoder.current_subfont = &subfont;

        error = psaux->t1_decoder_funcs->parse_charstrings(
                  &psdecoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          ((CID_GlyphSlot)decoder->builder.glyph)->hint = FALSE;

          force_scaling = TRUE;

          error = psaux->t1_decoder_funcs->parse_charstrings(
                    &psdecoder,
                    charstring + cs_offset,
                    glyph_length - cs_offset );
        }
      }
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error && inc && inc->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = FIXED_TO_INT( decoder->builder.left_bearing.x );
      metrics.bearing_y = 0;
      metrics.advance   = FIXED_TO_INT( decoder->builder.advance.x );
      metrics.advance_v = FIXED_TO_INT( decoder->builder.advance.y );

      error = inc->funcs->get_glyph_metrics( inc->object,
                                             glyph_index, FALSE, &metrics );

      decoder->builder.left_bearing.x = INT_TO_FIXED( metrics.bearing_x );
      decoder->builder.advance.x      = INT_TO_FIXED( metrics.advance );
      decoder->builder.advance.y      = INT_TO_FIXED( metrics.advance_v );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

  Exit:
    FT_FREE( charstring );

    ((CID_GlyphSlot)decoder->builder.glyph)->scaled = force_scaling;

    return error;
  }